

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.cc
# Opt level: O0

void __thiscall gvr::Model::setOriginToPLY(Model *this,PLYWriter *ply)

{
  ostream *poVar1;
  PLYWriter *this_00;
  ostream *poVar2;
  basic_ostream<char,_std::char_traits<char>_> *out_00;
  int __x;
  long in_RDI;
  double dVar3;
  double extraout_XMM0_Qa;
  ostringstream out2;
  ostringstream out;
  SMatrix<double,_3,_3> *in_stack_fffffffffffffc38;
  basic_ostream<char,_std::char_traits<char>_> *in_stack_fffffffffffffc40;
  SMatrix<double,_3,_3> *in_stack_fffffffffffffcb0;
  ostringstream local_330 [376];
  string local_1b8 [48];
  long local_188 [49];
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_188);
  std::ios_base::precision((ios_base *)((long)local_188 + *(long *)(local_188[0] + -0x18)),0x10);
  poVar1 = std::operator<<((ostream *)local_188,"Origin ");
  dVar3 = gmath::SVector<double,_3>::operator[]((SVector<double,_3> *)(in_RDI + 0x10),0);
  this_00 = (PLYWriter *)std::ostream::operator<<(poVar1,dVar3);
  poVar1 = std::operator<<((ostream *)this_00," ");
  dVar3 = gmath::SVector<double,_3>::operator[]((SVector<double,_3> *)(in_RDI + 0x10),1);
  poVar2 = (ostream *)std::ostream::operator<<(poVar1,dVar3);
  poVar2 = std::operator<<(poVar2," ");
  dVar3 = gmath::SVector<double,_3>::operator[]((SVector<double,_3> *)(in_RDI + 0x10),2);
  std::ostream::operator<<(poVar2,dVar3);
  std::__cxx11::ostringstream::str();
  PLYWriter::addComment(this_00,(string *)poVar1);
  std::__cxx11::string::~string(local_1b8);
  __x = (int)in_RDI + 0x28;
  gmath::det<double>(in_stack_fffffffffffffcb0);
  std::abs(__x);
  if (extraout_XMM0_Qa < 1e-06) {
    std::__cxx11::ostringstream::ostringstream(local_330);
    std::operator<<((ostream *)local_330,"Camera ");
    out_00 = gmath::operator<<(in_stack_fffffffffffffc40,in_stack_fffffffffffffc38);
    poVar2 = std::operator<<(out_00," ");
    gmath::operator<<(out_00,(SVector<double,_3> *)poVar2);
    std::__cxx11::ostringstream::str();
    PLYWriter::addComment(this_00,(string *)poVar1);
    std::__cxx11::string::~string((string *)&stack0xfffffffffffffcb0);
    std::__cxx11::ostringstream::~ostringstream(local_330);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_188);
  return;
}

Assistant:

void Model::setOriginToPLY(PLYWriter &ply) const
{
  std::ostringstream out;

  out.precision(16);
  out << "Origin " << origin[0] << " " << origin[1] << " " << origin[2];
  ply.addComment(out.str());

  if (std::abs(det(Rc)-1) < 1e-6)
  {
    std::ostringstream out2;

    out2 << "Camera " << Rc << " " << Tc;
    ply.addComment(out2.str());
  }
}